

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_cmp(TCGContext_conflict9 *s,TCGArg arg1,TCGArg arg2,int const_arg2,int rexw)

{
  int dest;
  
  dest = (int)arg1;
  if (const_arg2 == 0) {
    tgen_arithr(s,rexw + 7,dest,(int)arg2);
    return;
  }
  if (arg2 != 0) {
    tgen_arithi(s,rexw + 7,dest,arg2,0);
    return;
  }
  tcg_out_modrm(s,rexw + 0x85,dest,dest);
  return;
}

Assistant:

static void tcg_out_cmp(TCGContext *s, TCGArg arg1, TCGArg arg2,
                        int const_arg2, int rexw)
{
    if (const_arg2) {
        if (arg2 == 0) {
            /* test r, r */
            tcg_out_modrm(s, OPC_TESTL + rexw, arg1, arg1);
        } else {
            tgen_arithi(s, ARITH_CMP + rexw, arg1, arg2, 0);
        }
    } else {
        tgen_arithr(s, ARITH_CMP + rexw, arg1, arg2);
    }
}